

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O1

exr_result_t internal_exr_apply_rle(exr_encode_pipeline_t *encode)

{
  char cVar1;
  ulong newsz;
  char *pcVar2;
  exr_result_t eVar3;
  char *pcVar4;
  uint64_t uVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  
  newsz = encode->packed_bytes;
  eVar3 = internal_encode_alloc_buffer
                    (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
                     &encode->scratch_alloc_size_1,newsz);
  if (eVar3 == 0) {
    pcVar2 = (char *)encode->scratch_buffer_1;
    if (0 < (long)newsz) {
      pcVar4 = (char *)((long)encode->packed_buffer + newsz);
      pcVar9 = pcVar2 + (newsz + 1 >> 1);
      pcVar7 = (char *)encode->packed_buffer;
      pcVar10 = pcVar2;
      do {
        pcVar8 = pcVar7 + 1;
        *pcVar10 = *pcVar7;
        if (pcVar8 < pcVar4) {
          pcVar8 = pcVar7 + 2;
          *pcVar9 = pcVar7[1];
          pcVar9 = pcVar9 + 1;
        }
        pcVar10 = pcVar10 + 1;
        pcVar7 = pcVar8;
      } while (pcVar8 < pcVar4);
    }
    if (1 < (long)newsz) {
      pcVar4 = pcVar2 + 1;
      cVar6 = *pcVar2;
      do {
        cVar1 = *pcVar4;
        *pcVar4 = (cVar1 - cVar6) + -0x80;
        pcVar4 = pcVar4 + 1;
        cVar6 = cVar1;
      } while (pcVar4 < pcVar2 + newsz);
    }
    uVar5 = internal_rle_compress
                      (encode->compressed_buffer,encode->compressed_alloc_size,
                       encode->scratch_buffer_1,newsz);
    if (newsz <= uVar5) {
      memcpy(encode->compressed_buffer,encode->packed_buffer,newsz);
      uVar5 = newsz;
    }
    encode->compressed_bytes = uVar5;
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

exr_result_t
internal_exr_apply_rle (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;
    uint64_t     outb, srcb;

    srcb = encode->packed_bytes;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        srcb);
    if (rv != EXR_ERR_SUCCESS) return rv;

    reorder_and_predict (encode->scratch_buffer_1, encode->packed_buffer, srcb);

    outb = internal_rle_compress (
        encode->compressed_buffer,
        encode->compressed_alloc_size,
        encode->scratch_buffer_1,
        srcb);

    if (outb >= srcb)
    {
        memcpy (encode->compressed_buffer, encode->packed_buffer, srcb);
        outb = srcb;
    }
    encode->compressed_bytes = outb;
    return EXR_ERR_SUCCESS;
}